

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::reconnect(session_base_t *this)

{
  bool bVar1;
  string *this_00;
  long *in_RDI;
  bool in_stack_0000000f;
  pipe_t *in_stack_00000010;
  string *ep;
  own_t *in_stack_00000020;
  object_t *in_stack_00000028;
  bool in_stack_0000012f;
  session_base_t *in_stack_00000130;
  string *in_stack_00000190;
  address_t *in_stack_00000198;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  value_type *in_stack_ffffffffffffffe8;
  undefined1 in_stack_fffffffffffffff0;
  undefined7 in_stack_fffffffffffffff1;
  
  if (((in_RDI[0xb1] != 0) && (*(int *)((long)in_RDI + 0x184) == 1)) &&
     (bVar1 = std::operator!=(in_stack_ffffffffffffffd0,
                              (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
     , bVar1)) {
    pipe_t::hiccup((pipe_t *)in_stack_00000020);
    pipe_t::terminate(in_stack_00000010,in_stack_0000000f);
    std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::insert
              ((set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *)
               CONCAT71(in_stack_fffffffffffffff1,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
    in_RDI[0xb1] = 0;
    if ((*(byte *)(in_RDI + 0xbd) & 1) != 0) {
      io_object_t::cancel_timer((io_object_t *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      *(undefined1 *)(in_RDI + 0xbd) = 0;
    }
  }
  (**(code **)(*in_RDI + 0xc0))();
  if ((int)in_RDI[0x2c] < 1) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string(this_00);
    address_t::to_string(in_stack_00000198,in_stack_00000190);
    object_t::send_term_endpoint(in_stack_00000028,in_stack_00000020,ep);
  }
  else {
    start_connecting(in_stack_00000130,in_stack_0000012f);
  }
  if ((in_RDI[0xb1] != 0) &&
     (((*(char *)((long)in_RDI + 0x14c) == '\x02' || (*(char *)((long)in_RDI + 0x14c) == '\n')) ||
      (*(char *)((long)in_RDI + 0x14c) == '\x0f')))) {
    pipe_t::hiccup((pipe_t *)in_stack_00000020);
  }
  return;
}

Assistant:

void zmq::session_base_t::reconnect ()
{
    //  For delayed connect situations, terminate the pipe
    //  and reestablish later on
    if (_pipe && options.immediate == 1
#ifdef ZMQ_HAVE_OPENPGM
        && _addr->protocol != protocol_name::pgm
        && _addr->protocol != protocol_name::epgm
#endif
#ifdef ZMQ_HAVE_NORM
        && _addr->protocol != protocol_name::norm
#endif
        && _addr->protocol != protocol_name::udp) {
        _pipe->hiccup ();
        _pipe->terminate (false);
        _terminating_pipes.insert (_pipe);
        _pipe = NULL;

        if (_has_linger_timer) {
            cancel_timer (linger_timer_id);
            _has_linger_timer = false;
        }
    }

    reset ();

    //  Reconnect.
    if (options.reconnect_ivl > 0)
        start_connecting (true);
    else {
        std::string *ep = new (std::string);
        _addr->to_string (*ep);
        send_term_endpoint (_socket, ep);
    }

    //  For subscriber sockets we hiccup the inbound pipe, which will cause
    //  the socket object to resend all the subscriptions.
    if (_pipe
        && (options.type == ZMQ_SUB || options.type == ZMQ_XSUB
            || options.type == ZMQ_DISH))
        _pipe->hiccup ();
}